

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

WebPDecBuffer * GetOutputBuffer(WebPIDecoder *idec)

{
  if ((((idec != (WebPIDecoder *)0x0) && (idec->dec_ != (void *)0x0)) &&
      (STATE_VP8_PARTS0 < idec->state_)) && (idec->final_output_ == (WebPDecBuffer *)0x0)) {
    return (idec->params_).output;
  }
  return (WebPDecBuffer *)0x0;
}

Assistant:

static const WebPDecBuffer* GetOutputBuffer(const WebPIDecoder* const idec) {
  if (idec == NULL || idec->dec_ == NULL) {
    return NULL;
  }
  if (idec->state_ <= STATE_VP8_PARTS0) {
    return NULL;
  }
  if (idec->final_output_ != NULL) {
    return NULL;   // not yet slow-copied
  }
  return idec->params_.output;
}